

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

int nn_dns_check_hostname(char *name,size_t namelen)

{
  int labelsz;
  size_t namelen_local;
  char *name_local;
  
  if (((namelen != 0) && (namelen < 0x100)) && (*name != '-')) {
    labelsz = 0;
    namelen_local = namelen;
    name_local = name;
    do {
      while( true ) {
        if (namelen_local == 0) {
          return 0;
        }
        if (*name_local != '.') break;
        if (labelsz == 0) {
          return -0x16;
        }
        labelsz = 0;
        name_local = name_local + 1;
        namelen_local = namelen_local - 1;
      }
      if (((((*name_local < 'a') || ('z' < *name_local)) &&
           ((*name_local < 'A' || ('Z' < *name_local)))) &&
          ((*name_local < '0' || ('9' < *name_local)))) && (*name_local != '-')) {
        return -0x16;
      }
      name_local = name_local + 1;
      namelen_local = namelen_local - 1;
      labelsz = labelsz + 1;
    } while (labelsz < 0x40);
  }
  return -0x16;
}

Assistant:

int nn_dns_check_hostname (const char *name, size_t namelen)
{
    int labelsz;

    /*  There has to be at least one label in the hostname.
        Additionally, hostnames are up to 255 characters long. */
    if (namelen < 1 || namelen > 255)
        return -EINVAL;

    /*  Hyphen can't be used as a first character of the hostname. */
    if (*name == '-')
        return -EINVAL;

    labelsz = 0;
    while (1) {

        /*  End of the hostname. */
        if (namelen == 0) {
            /*  Success! */
            return 0;
        }

        /*  End of a label. */
        if (*name == '.') {

            /*  The old label cannot be empty. */
            if (labelsz == 0)
                return -EINVAL;

            /*  Start new label. */
            labelsz = 0;
            ++name;
            --namelen;
            continue;
        }

        /*  Valid character. */
        if ((*name >= 'a' && *name <= 'z') ||
              (*name >= 'A' && *name <= 'Z') ||
              (*name >= '0' && *name <= '9') ||
              *name == '-') {
            ++name;
            --namelen;
            ++labelsz;

            /*  Labels longer than 63 charcters are not permitted. */
            if (labelsz > 63)
                return -EINVAL;

            continue;
        }

        /*  Invalid character. */
        return -EINVAL;
    }
}